

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

double xmlXPathStringEvalNumber(xmlChar *str)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  xmlChar *cur;
  byte *pbVar13;
  double dVar14;
  double dVar15;
  
  if (str == (xmlChar *)0x0) {
    return 0.0;
  }
  while( true ) {
    bVar3 = *str;
    if ((0x20 < (ulong)bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) break;
    str = str + 1;
  }
  uVar11 = (ulong)(bVar3 == 0x2d);
  if (str[uVar11] != 0x2e && (byte)(str[uVar11] - 0x3a) < 0xf6) {
    return xmlXPathNAN;
  }
  pbVar13 = str + uVar11;
  bVar12 = *pbVar13;
  bVar8 = bVar12 - 0x30;
  dVar14 = 0.0;
  dVar4 = 0.0;
  if (bVar8 < 10) {
    do {
      dVar14 = (double)(bVar12 & 0xf) + dVar14 * 10.0;
      bVar12 = str[uVar11 + 1];
      uVar11 = uVar11 + 1;
    } while ((byte)(bVar12 - 0x30) < 10);
    pbVar13 = str + uVar11;
    dVar4 = dVar14;
  }
  if (bVar12 != 0x2e) goto LAB_001c1702;
  pbVar7 = pbVar13 + 1;
  pbVar13 = pbVar13 + 1;
  if (*pbVar7 < 0x30) {
    if (bVar8 < 10) goto LAB_001c1651;
LAB_001c163f:
    bVar5 = false;
    dVar14 = xmlXPathNAN;
  }
  else {
    if ((9 < bVar8) && (0x39 < *pbVar7)) goto LAB_001c163f;
LAB_001c1651:
    uVar9 = 0;
    if (*pbVar13 == 0x30) {
      uVar9 = 0;
      pbVar7 = pbVar13;
      do {
        uVar9 = uVar9 + 1;
        pbVar13 = pbVar7 + 1;
        pbVar2 = pbVar7 + 1;
        pbVar7 = pbVar13;
      } while (*pbVar2 == 0x30);
    }
    bVar12 = *pbVar13;
    dVar15 = 0.0;
    if ((byte)(bVar12 - 0x30) < 10) {
      uVar1 = uVar9 + 0x14;
      do {
        dVar15 = dVar15 * 10.0 + (double)(int)(bVar12 - 0x30);
        uVar9 = uVar9 + 1;
        bVar12 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
        if (9 < (byte)(bVar12 - 0x30)) break;
      } while (uVar9 < uVar1);
    }
    dVar14 = pow(10.0,(double)(int)uVar9);
    pbVar13 = pbVar13 + -1;
    do {
      pbVar7 = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    } while ((byte)(*pbVar7 - 0x30) < 10);
    dVar4 = dVar4 + dVar15 / dVar14;
    bVar5 = true;
  }
  if (!bVar5) {
    return dVar14;
  }
LAB_001c1702:
  if ((*pbVar13 | 0x20) == 0x65) {
    bVar5 = false;
    if (pbVar13[1] == 0x2b) {
      pbVar13 = pbVar13 + 2;
    }
    else if (pbVar13[1] == 0x2d) {
      pbVar13 = pbVar13 + 2;
      bVar5 = true;
    }
    else {
      pbVar13 = pbVar13 + 1;
    }
    bVar12 = *pbVar13;
    if ((byte)(bVar12 - 0x30) < 10) {
      iVar10 = 0;
      do {
        iVar6 = (bVar12 - 0x30) + iVar10 * 10;
        if (999999 < iVar10) {
          iVar6 = iVar10;
        }
        iVar10 = iVar6;
        bVar12 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while ((byte)(bVar12 - 0x30) < 10);
    }
    else {
      iVar10 = 0;
    }
  }
  else {
    iVar10 = 0;
    bVar5 = false;
  }
  while( true ) {
    uVar11 = (ulong)*pbVar13;
    if (0x20 < uVar11) {
      return xmlXPathNAN;
    }
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
    pbVar13 = pbVar13 + 1;
  }
  if (uVar11 != 0) {
    return xmlXPathNAN;
  }
  if (bVar3 == 0x2d) {
    dVar4 = -dVar4;
  }
  iVar6 = -iVar10;
  if (!bVar5) {
    iVar6 = iVar10;
  }
  dVar14 = pow(10.0,(double)iVar6);
  return dVar14 * dVar4;
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9'))) {
        return(xmlXPathNAN);
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(xmlXPathNAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(xmlXPathNAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}